

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Vector.cpp
# Opt level: O1

LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> * __thiscall
KDIS::DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)'\x03'>_>::operator*
          (LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *__return_storage_ptr__,
          LE_Vector<KDIS::DATA_TYPE::KFIXED<char,_(unsigned_char)__x03_>_> *this,KFLOAT64 Value)

{
  KFIXED<char,_(unsigned_char)__x03_> local_70;
  KFIXED<char,_(unsigned_char)__x03_> local_60;
  KFIXED<char,_(unsigned_char)__x03_> local_50;
  KFIXED<char,_(unsigned_char)__x03_> local_40;
  KFIXED<char,_(unsigned_char)__x03_> local_30;
  KFIXED<char,_(unsigned_char)__x03_> local_20;
  
  (__return_storage_ptr__->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__LE_Vector_0022dfa8;
  (__return_storage_ptr__->m_X).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_0022b238;
  (__return_storage_ptr__->m_X).m_Val = (this->m_X).m_Val;
  (__return_storage_ptr__->m_Y).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_0022b238;
  (__return_storage_ptr__->m_Y).m_Val = (this->m_Y).m_Val;
  (__return_storage_ptr__->m_Z).super_DataTypeBase._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_0022b238;
  (__return_storage_ptr__->m_Z).m_Val = (this->m_Z).m_Val;
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_50,Value);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_20,&__return_storage_ptr__->m_X);
  DataTypeBase::~DataTypeBase(&local_20.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_50.super_DataTypeBase);
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_60,Value);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_30,&__return_storage_ptr__->m_Y);
  DataTypeBase::~DataTypeBase(&local_30.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_60.super_DataTypeBase);
  KFIXED<char,_(unsigned_char)'\x03'>::operator*(&local_70,Value);
  KFIXED<char,_(unsigned_char)'\x03'>::operator=(&local_40,&__return_storage_ptr__->m_Z);
  DataTypeBase::~DataTypeBase(&local_40.super_DataTypeBase);
  DataTypeBase::~DataTypeBase(&local_70.super_DataTypeBase);
  return __return_storage_ptr__;
}

Assistant:

LE_Vector<Type> LE_Vector<Type>::operator * ( KFLOAT64 Value ) const
{
    LE_Vector tmp = *this;
    tmp.m_X = tmp.m_X * Value;
    tmp.m_Y = tmp.m_Y * Value;
    tmp.m_Z = tmp.m_Z * Value;
    return tmp;
}